

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator==
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__x03_> local_58;
  KFIXED<short,_(unsigned_char)__x03_> local_48;
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  
  local_38.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0021b1a0;
  local_38.m_Val = (Value->m_X).m_Val;
  KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_X,&local_38);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  if (!KVar1) {
    local_48.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0021b1a0;
    local_48.m_Val = (Value->m_Y).m_Val;
    KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_Y,&local_48);
    DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
    if (!KVar1) {
      local_58.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0021b1a0;
      local_58.m_Val = (Value->m_Z).m_Val;
      KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_Z,&local_58);
      DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
      return !KVar1;
    }
  }
  return false;
}

Assistant:

KBOOL LE_Vector<Type>::operator == ( const LE_Vector & Value ) const
{
    if( m_X != Value.m_X ) return false;
    if( m_Y != Value.m_Y ) return false;
    if( m_Z != Value.m_Z ) return false;
    return true;
}